

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwtUtil.c
# Opt level: O1

Rwt_Node_t *
Rwt_ManAddNode(Rwt_Man_t *p,Rwt_Node_t *p0,Rwt_Node_t *p1,int fExor,int Level,int Volume)

{
  Vec_Ptr_t *pVVar1;
  Rwt_Node_t *pRVar2;
  Rwt_Node_t **ppRVar3;
  uint uVar4;
  Rwt_Node_t *pRVar5;
  void **ppvVar6;
  uint uVar7;
  Rwt_Node_t **ppRVar8;
  int iVar9;
  uint uVar10;
  
  p->nConsidered = p->nConsidered + 1;
  if (fExor == 0) {
    if (((ulong)p0 & 1) == 0) {
      uVar4 = *(uint *)&p0->field_0x8;
    }
    else {
      uVar4 = ~*(uint *)(((ulong)p0 & 0xfffffffffffffffe) + 8);
    }
    if (((ulong)p1 & 1) == 0) {
      uVar7 = *(uint *)&p1->field_0x8;
    }
    else {
      uVar7 = ~*(uint *)(((ulong)p1 & 0xfffffffffffffffe) + 8);
    }
    uVar7 = uVar7 & uVar4;
  }
  else {
    uVar7 = *(uint *)&p1->field_0x8 ^ *(uint *)&p0->field_0x8;
  }
  uVar10 = uVar7 & 0xffff;
  pRVar5 = (Rwt_Node_t *)Mem_FixedEntryFetch(p->pMmNode);
  pRVar5->Id = p->vForest->nSize;
  pRVar5->TravId = 0;
  *(uint *)&pRVar5->field_0x8 =
       fExor << 0x1f | (Volume & 0xffU) << 0x10 | (Level & 0x3fU) << 0x18 | uVar10;
  pRVar5->p0 = p0;
  pRVar5->p1 = p1;
  pRVar5->pNext = (Rwt_Node_t *)0x0;
  pVVar1 = p->vForest;
  uVar4 = pVVar1->nCap;
  if (pVVar1->nSize == uVar4) {
    if ((int)uVar4 < 0x10) {
      if (pVVar1->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc(0x80);
      }
      else {
        ppvVar6 = (void **)realloc(pVVar1->pArray,0x80);
      }
      pVVar1->pArray = ppvVar6;
      iVar9 = 0x10;
    }
    else {
      iVar9 = uVar4 * 2;
      if (iVar9 <= (int)uVar4) goto LAB_004bb8ab;
      if (pVVar1->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc((ulong)uVar4 << 4);
      }
      else {
        ppvVar6 = (void **)realloc(pVVar1->pArray,(ulong)uVar4 << 4);
      }
      pVVar1->pArray = ppvVar6;
    }
    pVVar1->nCap = iVar9;
  }
LAB_004bb8ab:
  iVar9 = pVVar1->nSize;
  pVVar1->nSize = iVar9 + 1;
  pVVar1->pArray[iVar9] = pRVar5;
  if (p->puCanons[uVar10] == (unsigned_short)uVar7) {
    p->nAdded = p->nAdded + 1;
    if (p->pTable[uVar10] == (Rwt_Node_t *)0x0) {
      p->nClasses = p->nClasses + 1;
    }
    ppRVar3 = p->pTable + uVar10;
    do {
      ppRVar8 = ppRVar3;
      pRVar2 = *ppRVar8;
      ppRVar3 = &pRVar2->pNext;
    } while (pRVar2 != (Rwt_Node_t *)0x0);
    *ppRVar8 = pRVar5;
  }
  return pRVar5;
}

Assistant:

Rwt_Node_t * Rwt_ManAddNode( Rwt_Man_t * p, Rwt_Node_t * p0, Rwt_Node_t * p1, int fExor, int Level, int Volume )
{
    Rwt_Node_t * pNew;
    unsigned uTruth;
    // compute truth table, leve, volume
    p->nConsidered++;
    if ( fExor )
        uTruth = (p0->uTruth ^ p1->uTruth);
    else
        uTruth = (Rwt_IsComplement(p0)? ~Rwt_Regular(p0)->uTruth : Rwt_Regular(p0)->uTruth) &
                 (Rwt_IsComplement(p1)? ~Rwt_Regular(p1)->uTruth : Rwt_Regular(p1)->uTruth) & 0xFFFF;
    // create the new node
    pNew = (Rwt_Node_t *)Mem_FixedEntryFetch( p->pMmNode );
    pNew->Id     = p->vForest->nSize;
    pNew->TravId = 0;
    pNew->uTruth = uTruth;
    pNew->Level  = Level;
    pNew->Volume = Volume;
    pNew->fUsed  = 0;
    pNew->fExor  = fExor;
    pNew->p0     = p0;
    pNew->p1     = p1;
    pNew->pNext  = NULL;
    Vec_PtrPush( p->vForest, pNew );
    // do not add if the node is not essential
    if ( uTruth != p->puCanons[uTruth] )
        return pNew;

    // add to the list
    p->nAdded++;
    if ( p->pTable[uTruth] == NULL )
        p->nClasses++;
    Rwt_ListAddToTail( p->pTable + uTruth, pNew );
    return pNew;
}